

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O2

status_t __thiscall
libtorrent::aux::posix_storage::initialize
          (posix_storage *this,settings_interface *param_1,storage_error *ec)

{
  pointer psVar1;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
  oversized_file;
  int64_t iVar2;
  bool bVar3;
  int num_files;
  int64_t iVar4;
  file_storage *pfVar5;
  file_index_t index;
  long lVar6;
  undefined1 auStack_118 [15];
  status_t ret;
  string *save_path;
  error_code err;
  file_status s;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
  local_90;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  string file_path;
  
  pfVar5 = (this->m_mapped_files)._M_t.
           super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
           .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (pfVar5 == (file_storage *)0x0) {
    pfVar5 = this->m_files;
  }
  num_files = file_storage::num_files(pfVar5);
  stat_cache::reserve(&this->m_stat_cache,num_files);
  pfVar5 = (this->m_mapped_files)._M_t.
           super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
           .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (pfVar5 == (file_storage *)0x0) {
    pfVar5 = this->m_files;
  }
  ret.m_val = '\0';
  save_path = &this->m_save_path;
  for (lVar6 = 0;
      psVar1 = (this->m_file_priority).
               super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               .
               super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar6 < *(int *)&(this->m_file_priority).
                       super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       .
                       super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1; lVar6 = lVar6 + 1)
  {
    if (psVar1[lVar6].m_val == '\0') {
      index.m_val = (int)lVar6;
      bVar3 = file_storage::pad_file_at(pfVar5,index);
      if (!bVar3) {
        s.mtime = 0;
        s.ctime = 0;
        s.file_size = 0;
        s.atime = 0;
        s.mode.m_val = 0;
        file_storage::file_path(&file_path,pfVar5,index,save_path);
        err.val_ = 0;
        err.failed_ = false;
        err.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                    super_error_category;
        stat_file(&file_path,&s,&err,(file_status_flag_t)0x0);
        iVar2 = s.file_size;
        iVar4 = file_storage::file_size(pfVar5,index);
        if (iVar4 < iVar2) {
          ret.m_val = '\b';
        }
        if (err.failed_ == false) {
          use_partfile(this,index,false);
        }
        else {
          need_partfile(this);
        }
        ::std::__cxx11::string::~string((string *)&file_path);
      }
    }
  }
  local_70._8_8_ = 0;
  local_58 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:398:6)>
             ::_M_invoke;
  local_60 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:398:6)>
             ::_M_manager;
  local_90.super__Function_base._M_functor._8_8_ = 0;
  local_90.super__Function_base._M_functor._M_unused._M_object = create_symlink;
  local_90._M_invoker =
       ::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
       ::_M_invoke;
  local_b0._8_8_ = 0;
  local_90.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
       ::_M_manager;
  local_b0._M_unused._M_object = &ret;
  local_98 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:401:6)>
             ::_M_invoke;
  local_a0 = ::std::
             _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:401:6)>
             ::_M_manager;
  oversized_file.super__Function_base._M_functor._8_8_ = ec;
  oversized_file.super__Function_base._M_functor._M_unused._M_object = &local_b0;
  oversized_file._16_15_ = auStack_118;
  oversized_file._M_invoker._7_1_ = ret.m_val;
  local_70._M_unused._M_object = this;
  initialize_storage(pfVar5,save_path,&this->m_stat_cache,&this->m_file_priority,
                     (function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
                      *)&local_70,&local_90,oversized_file,(storage_error *)save_path);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  ::std::_Function_base::~_Function_base(&local_90.super__Function_base);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_70);
  return (status_t)ret.m_val;
}

Assistant:

status_t posix_storage::initialize(settings_interface const&, storage_error& ec)
	{
		m_stat_cache.reserve(files().num_files());

		file_storage const& fs = files();
		// if some files have priority 0, we need to check if they exist on the
		// filesystem, in which case we won't use a partfile for them.
		// this is to be backwards compatible with previous versions of
		// libtorrent, when part files were not supported.
		status_t ret{};
		for (file_index_t i(0); i < m_file_priority.end_index(); ++i)
		{
			if (m_file_priority[i] != dont_download || fs.pad_file_at(i))
				continue;

			file_status s;
			std::string const file_path = fs.file_path(i, m_save_path);
			error_code err;
			stat_file(file_path, &s, err);

			if (s.file_size > fs.file_size(i))
				ret |= disk_status::oversized_file;

			if (!err)
			{
				use_partfile(i, false);
			}
			else
			{
				need_partfile();
			}
		}

		aux::initialize_storage(fs, m_save_path, m_stat_cache, m_file_priority
			, [this](file_index_t const file_index, storage_error& e)
			{ open_file(file_index, aux::open_mode::write, 0, e); }
			, aux::create_symlink
			, [&ret](file_index_t, std::int64_t) { ret |= disk_status::oversized_file; }
			, ec);
		return ret;
	}